

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O0

void __thiscall JetHead::list<Timer::TimerNode>::~list(list<Timer::TimerNode> *this)

{
  Node *pNVar1;
  Node *this_00;
  Node *temp;
  list<Timer::TimerNode> *this_local;
  
  while (this->mHead != (Node *)0x0) {
    pNVar1 = this->mHead->next;
    this_00 = this->mHead;
    if (this_00 != (Node *)0x0) {
      Node::~Node(this_00);
      operator_delete(this_00,0x38);
    }
    this->mHead = pNVar1;
  }
  this->mTail = (Node *)0x0;
  return;
}

Assistant:

~list()
		{
			while (mHead != NULL)
			{
				Node* temp = mHead->next;
				delete mHead;
				mHead = temp;
			}
			mTail = NULL;
		}